

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::ProgressTask::~ProgressTask(ProgressTask *this)

{
  long lVar1;
  ProgressClient *pPVar2;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  this->_vptr_ProgressTask = (_func_int **)&PTR__ProgressTask_001ad7a0;
  if (this->quiet_ == false) {
    if (::(anonymous_namespace)::progress_tasks_._48_8_ ==
        ::(anonymous_namespace)::progress_tasks_._16_8_) {
      std::__cxx11::string::string((string *)&local_28,"!progress_tasks_.empty()",&local_49);
      std::__cxx11::string::string
                ((string *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,&local_4a);
      geo_assertion_failed(&local_28,&local_48,0x1878);
    }
    lVar1 = ::(anonymous_namespace)::progress_tasks_._48_8_;
    if (::(anonymous_namespace)::progress_tasks_._48_8_ ==
        ::(anonymous_namespace)::progress_tasks_._56_8_) {
      lVar1 = *(long *)(::(anonymous_namespace)::progress_tasks_._72_8_ + -8) + 0x200;
    }
    if (*(ProgressTask **)(lVar1 + -8) != this) {
      std::__cxx11::string::string((string *)&local_28,"progress_tasks_.top() == task",&local_49);
      std::__cxx11::string::string
                ((string *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,&local_4a);
      geo_assertion_failed(&local_28,&local_48,0x1879);
    }
    if (::(anonymous_namespace)::progress_client_ != 0) {
      pPVar2 = SmartPointer<GEO::ProgressClient>::operator->
                         ((SmartPointer<GEO::ProgressClient> *)
                          &::(anonymous_namespace)::progress_client_);
      (*(pPVar2->super_Counted)._vptr_Counted[4])
                (pPVar2,(ulong)::(anonymous_namespace)::task_canceled_);
    }
    std::deque<const_GEO::ProgressTask_*,_std::allocator<const_GEO::ProgressTask_*>_>::pop_back
              ((deque<const_GEO::ProgressTask_*,_std::allocator<const_GEO::ProgressTask_*>_> *)
               ::(anonymous_namespace)::progress_tasks_);
    if (::(anonymous_namespace)::progress_tasks_._48_8_ ==
        ::(anonymous_namespace)::progress_tasks_._16_8_) {
      ::(anonymous_namespace)::task_canceled_ = 0;
    }
  }
  std::__cxx11::string::~string((string *)&this->task_name_);
  return;
}

Assistant:

ProgressTask::~ProgressTask() {
        if(!quiet_) {
            end_task(this);
        }
    }